

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Expr * sqlite3ExprAlloc(sqlite3 *db,int op,Token *pToken,int dequote)

{
  byte bVar1;
  int iVar2;
  Expr *pEVar3;
  int iVar4;
  int iValue;
  int local_2c;
  
  local_2c = 0;
  iVar4 = 0;
  if (pToken != (Token *)0x0) {
    if ((op == 0x9b) && (pToken->z != (char *)0x0)) {
      iVar2 = sqlite3GetInt32(pToken->z,&local_2c);
      iVar4 = 0;
      if (iVar2 != 0) goto LAB_0017d137;
    }
    iVar4 = pToken->n + 1;
  }
LAB_0017d137:
  pEVar3 = (Expr *)sqlite3DbMallocRawNN(db,(long)iVar4 + 0x48);
  if (pEVar3 != (Expr *)0x0) {
    pEVar3->op = '\0';
    pEVar3->affExpr = '\0';
    pEVar3->op2 = '\0';
    pEVar3->field_0x3 = 0;
    pEVar3->flags = 0;
    (pEVar3->u).zToken = (char *)0x0;
    pEVar3->iColumn = 0;
    pEVar3->iAgg = 0;
    pEVar3->w = (anon_union_4_2_009eaf8f_for_w)0x0;
    pEVar3->pAggInfo = (AggInfo *)0x0;
    (pEVar3->x).pList = (ExprList *)0x0;
    pEVar3->nHeight = 0;
    pEVar3->iTable = 0;
    pEVar3->pLeft = (Expr *)0x0;
    pEVar3->pRight = (Expr *)0x0;
    (pEVar3->y).pTab = (Table *)0x0;
    pEVar3->op = (u8)op;
    pEVar3->iAgg = -1;
    if (pToken != (Token *)0x0) {
      if (iVar4 == 0) {
        pEVar3->flags = pEVar3->flags | (uint)(local_2c == 0) * 0x10000000 + 0x10800800;
        (pEVar3->u).iValue = local_2c;
      }
      else {
        (pEVar3->u).zToken = (char *)(pEVar3 + 1);
        if ((ulong)pToken->n != 0) {
          memcpy(pEVar3 + 1,pToken->z,(ulong)pToken->n);
        }
        (pEVar3->u).zToken[pToken->n] = '\0';
        if (dequote != 0) {
          bVar1 = *(pEVar3->u).zToken;
          if ((char)""[bVar1] < '\0') {
            pEVar3->flags = (uint)(bVar1 == 0x22) << 7 | pEVar3->flags | 0x4000000;
            sqlite3Dequote((pEVar3->u).zToken);
          }
        }
      }
    }
    pEVar3->nHeight = 1;
  }
  return pEVar3;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAlloc(
  sqlite3 *db,            /* Handle for sqlite3DbMallocRawNN() */
  int op,                 /* Expression opcode */
  const Token *pToken,    /* Token argument.  Might be NULL */
  int dequote             /* True to dequote */
){
  Expr *pNew;
  int nExtra = 0;
  int iValue = 0;

  assert( db!=0 );
  if( pToken ){
    if( op!=TK_INTEGER || pToken->z==0
          || sqlite3GetInt32(pToken->z, &iValue)==0 ){
      nExtra = pToken->n+1;
      assert( iValue>=0 );
    }
  }
  pNew = sqlite3DbMallocRawNN(db, sizeof(Expr)+nExtra);
  if( pNew ){
    memset(pNew, 0, sizeof(Expr));
    pNew->op = (u8)op;
    pNew->iAgg = -1;
    if( pToken ){
      if( nExtra==0 ){
        pNew->flags |= EP_IntValue|EP_Leaf|(iValue?EP_IsTrue:EP_IsFalse);
        pNew->u.iValue = iValue;
      }else{
        pNew->u.zToken = (char*)&pNew[1];
        assert( pToken->z!=0 || pToken->n==0 );
        if( pToken->n ) memcpy(pNew->u.zToken, pToken->z, pToken->n);
        pNew->u.zToken[pToken->n] = 0;
        if( dequote && sqlite3Isquote(pNew->u.zToken[0]) ){
          sqlite3DequoteExpr(pNew);
        }
      }
    }
#if SQLITE_MAX_EXPR_DEPTH>0
    pNew->nHeight = 1;
#endif
  }
  return pNew;
}